

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

ErrState * findErrorForCurrentThread(void)

{
  void *pvVar1;
  void *tid;
  ErrState *i;
  
  if (errorLock != (void *)0x0) {
    __PHYSFS_platformGrabMutex(errorLock);
  }
  if (errorStates != (ErrState *)0x0) {
    pvVar1 = __PHYSFS_platformGetThreadID();
    for (tid = errorStates; tid != (void *)0x0; tid = *(void **)((long)tid + 0x10)) {
      if (*tid == pvVar1) {
        if (errorLock != (void *)0x0) {
          __PHYSFS_platformReleaseMutex(errorLock);
        }
        return (ErrState *)tid;
      }
    }
  }
  if (errorLock != (void *)0x0) {
    __PHYSFS_platformReleaseMutex(errorLock);
  }
  return (ErrState *)0x0;
}

Assistant:

static ErrState *findErrorForCurrentThread(void)
{
    ErrState *i;
    void *tid;

    if (errorLock != NULL)
        __PHYSFS_platformGrabMutex(errorLock);

    if (errorStates != NULL)
    {
        tid = __PHYSFS_platformGetThreadID();

        for (i = errorStates; i != NULL; i = i->next)
        {
            if (i->tid == tid)
            {
                if (errorLock != NULL)
                    __PHYSFS_platformReleaseMutex(errorLock);
                return i;
            } /* if */
        } /* for */
    } /* if */

    if (errorLock != NULL)
        __PHYSFS_platformReleaseMutex(errorLock);

    return NULL;   /* no error available. */
}